

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O1

void __thiscall anon_func::FieldRemover::~FieldRemover(FieldRemover *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pTVar2;
  pointer pcVar3;
  
  pTVar2 = (this->
           super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
           super_PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>.
           super_Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task,_std::allocator<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>
                                          ).
                                          super_PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>
                                          .
                                          super_Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task,_std::allocator<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar2);
  }
  (this->super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
  super_Pass._vptr_Pass = (_func_int **)&PTR__Pass_00d87048;
  pcVar3 = (this->
           super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
           super_Pass.name._M_dataplus._M_p;
  paVar1 = &(this->
            super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
            super_Pass.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x110);
  return;
}

Assistant:

void removeFieldsInInstructions(Module& wasm) {
    struct FieldRemover : public WalkerPass<PostWalker<FieldRemover>> {
      bool isFunctionParallel() override { return true; }

      GlobalTypeOptimization& parent;

      FieldRemover(GlobalTypeOptimization& parent) : parent(parent) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<FieldRemover>(parent);
      }

      void visitStructNew(StructNew* curr) {
        if (curr->type == Type::unreachable) {
          return;
        }
        if (curr->isWithDefault()) {
          // Nothing to do, a default was written and will no longer be.
          return;
        }

        auto iter = parent.indexesAfterRemovals.find(curr->type.getHeapType());
        if (iter == parent.indexesAfterRemovals.end()) {
          return;
        }
        auto& indexesAfterRemoval = iter->second;

        auto& operands = curr->operands;
        assert(indexesAfterRemoval.size() == operands.size());

        // Check for side effects in removed fields. If there are any, we must
        // use locals to save the values (while keeping them in order).
        bool useLocals = false;
        for (Index i = 0; i < operands.size(); i++) {
          auto newIndex = indexesAfterRemoval[i];
          if (newIndex == RemovedField &&
              EffectAnalyzer(getPassOptions(), *getModule(), operands[i])
                .hasUnremovableSideEffects()) {
            useLocals = true;
            break;
          }
        }
        if (useLocals) {
          auto* func = getFunction();
          if (!func) {
            Fatal() << "TODO: side effects in removed fields in globals\n";
          }
          auto* block = Builder(*getModule()).makeBlock();
          auto sets =
            ChildLocalizer(curr, func, getModule(), getPassOptions()).sets;
          block->list.set(sets);
          block->list.push_back(curr);
          block->finalize(curr->type);
          replaceCurrent(block);
        }

        // Remove the unneeded operands.
        Index removed = 0;
        for (Index i = 0; i < operands.size(); i++) {
          auto newIndex = indexesAfterRemoval[i];
          if (newIndex != RemovedField) {
            assert(newIndex < operands.size());
            operands[newIndex] = operands[i];
          } else {
            removed++;
          }
        }
        operands.resize(operands.size() - removed);
      }

      void visitStructSet(StructSet* curr) {
        if (curr->ref->type == Type::unreachable) {
          return;
        }

        auto newIndex = getNewIndex(curr->ref->type.getHeapType(), curr->index);
        if (newIndex != RemovedField) {
          // Map to the new index.
          curr->index = newIndex;
        } else {
          // This field was removed, so just emit drops of our children, plus a
          // trap if the ref is null. Note that we must preserve the order of
          // operations here: the trap on a null ref happens after the value,
          // which might have side effects.
          Builder builder(*getModule());
          auto flipped = getResultOfFirst(curr->ref,
                                          builder.makeDrop(curr->value),
                                          getFunction(),
                                          getModule(),
                                          getPassOptions());
          replaceCurrent(
            builder.makeDrop(builder.makeRefAs(RefAsNonNull, flipped)));
        }
      }

      void visitStructGet(StructGet* curr) {
        if (curr->ref->type == Type::unreachable) {
          return;
        }

        auto newIndex = getNewIndex(curr->ref->type.getHeapType(), curr->index);
        // We must not remove a field that is read from.
        assert(newIndex != RemovedField);
        curr->index = newIndex;
      }

    private:
      Index getNewIndex(HeapType type, Index index) {
        auto iter = parent.indexesAfterRemovals.find(type);
        if (iter == parent.indexesAfterRemovals.end()) {
          return index;
        }
        auto& indexesAfterRemoval = iter->second;
        auto newIndex = indexesAfterRemoval[index];
        assert(newIndex < indexesAfterRemoval.size() ||
               newIndex == RemovedField);
        return newIndex;
      }
    };

    FieldRemover remover(*this);
    remover.run(getPassRunner(), &wasm);
    remover.runOnModuleCode(getPassRunner(), &wasm);
  }